

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::DoubleToDecimalCast<float,_short>
               (float input,short *result,CastParameters *parameters,uint8_t width,uint8_t scale)

{
  short sVar1;
  byte in_CL;
  byte in_DL;
  short *in_RDI;
  float in_XMM0_Da;
  string error;
  double roundedValue;
  double value;
  CastParameters *in_stack_ffffffffffffff68;
  string *error_message;
  string *in_stack_ffffffffffffff78;
  allocator<char> aStack_71;
  string asStack_70 [20];
  undefined4 in_stack_ffffffffffffffa4;
  string asStack_50 [32];
  double dStack_30;
  double dStack_28;
  byte bStack_19;
  short *psStack_10;
  byte bStack_1;
  
  dStack_28 = (double)in_XMM0_Da *
              *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)in_CL * 8);
  bStack_19 = in_DL;
  psStack_10 = in_RDI;
  dStack_30 = round(dStack_28);
  if ((dStack_30 <= -*(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)bStack_19 * 8)) ||
     (*(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)bStack_19 * 8) <= dStack_30)) {
    error_message = (string *)&aStack_71;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (asStack_70,"Could not cast value %f to DECIMAL(%d,%d)",(allocator *)error_message);
    StringUtil::Format<float,_unsigned_char,_unsigned_char>
              (in_stack_ffffffffffffff78,(float)((ulong)error_message >> 0x20),
               (uchar)((ulong)error_message >> 0x18),(uchar)((ulong)error_message >> 0x10));
    ::std::__cxx11::string::~string(asStack_70);
    ::std::allocator<char>::~allocator(&aStack_71);
    HandleCastError::AssignError(error_message,in_stack_ffffffffffffff68);
    bStack_1 = 0;
    ::std::__cxx11::string::~string(asStack_50);
  }
  else {
    sVar1 = Cast::Operation<float,_short>((float)in_stack_ffffffffffffffa4);
    *psStack_10 = sVar1;
    bStack_1 = 1;
  }
  return (bool)(bStack_1 & 1);
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	// For some reason PG does not use statistical rounding here (even though it _does_ for integers...)
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(roundedValue));
	return true;
}